

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxMemory.h
# Opt level: O3

void __thiscall
Jinx::StaticArena<1024UL,_16UL>::deallocate(StaticArena<1024UL,_16UL> *this,char *p,size_t n)

{
  StaticArena<1024UL,_16UL> *pSVar1;
  
  pSVar1 = (StaticArena<1024UL,_16UL> *)this->m_ptr;
  if ((this <= pSVar1) && (pSVar1 <= &this->m_ptr)) {
    if (&this->m_ptr < p || p < this) {
      MemFree(p,n);
    }
    else if ((StaticArena<1024UL,_16UL> *)(p + (n + 0xf & 0xfffffffffffffff0)) == pSVar1) {
      this->m_ptr = p;
    }
    return;
  }
  __assert_fail("pointer_in_buffer(m_ptr) && \"short_alloc has outlived arena\"",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxMemory.h"
                ,99,
                "void Jinx::StaticArena<1024>::deallocate(char *, std::size_t) [N = 1024, alignment = 16]"
               );
}

Assistant:

void StaticArena<N, alignment>::deallocate(char * p, std::size_t n) noexcept
	{
		assert(pointer_in_buffer(m_ptr) && "short_alloc has outlived arena");
		if (pointer_in_buffer(p))
		{
			n = align_up(n);
			if (p + n == m_ptr)
				m_ptr = p;
		}
		else
			Jinx::MemFree(p, n);
	}